

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogAux.h
# Opt level: O1

void Assimp::LogFunctions<Assimp::FBXImporter>::LogDebug(format *message)

{
  bool bVar1;
  Logger *this;
  char *__s;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    this = DefaultLogger::get();
    __s = Prefix();
    std::__cxx11::stringbuf::str();
    strlen(__s);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,(ulong)__s);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_50 = *plVar3;
      lStack_48 = plVar2[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar3;
      local_60 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    Logger::debug(this,(char *)local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  return;
}

Assistant:

static void LogDebug(const Formatter::format& message)  {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_DEBUG(Prefix()+(std::string)message);
        }
    }